

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

bool tinyxml2::XMLUtil::ToInt64(char *str,int64_t *value)

{
  int iVar1;
  byte bVar2;
  char *pcVar3;
  byte *pbVar4;
  unsigned_long_long v;
  
  bVar2 = *str;
  if (-1 < (char)bVar2) {
    pbVar4 = (byte *)(str + 1);
    do {
      iVar1 = isspace((uint)bVar2);
      if (iVar1 == 0) {
        if ((bVar2 == 0x30) && ((*pbVar4 & 0xdf) == 0x58)) {
          pcVar3 = "%llx";
          goto LAB_001179b0;
        }
        break;
      }
      bVar2 = *pbVar4;
      pbVar4 = pbVar4 + 1;
    } while (-1 < (char)bVar2);
  }
  pcVar3 = "%lld";
LAB_001179b0:
  iVar1 = __isoc99_sscanf(str,pcVar3);
  if (iVar1 == 1) {
    *value = 0;
  }
  return iVar1 == 1;
}

Assistant:

bool XMLUtil::ToInt64(const char* str, int64_t* value)
{
    if (IsPrefixHex(str)) {
        unsigned long long v = 0;	// horrible syntax trick to make the compiler happy about %llx
        if (TIXML_SSCANF(str, "%llx", &v) == 1) {
            *value = static_cast<int64_t>(v);
            return true;
        }
    }
    else {
        long long v = 0;	// horrible syntax trick to make the compiler happy about %lld
        if (TIXML_SSCANF(str, "%lld", &v) == 1) {
            *value = static_cast<int64_t>(v);
            return true;
        }
    }
	return false;
}